

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void ReadableSizeString(size_t SizeInBytes,char *Output,size_t size)

{
  uint uVar1;
  size_t sVar2;
  size_t LastSizeInBytes;
  
  uVar1 = 0;
  sVar2 = SizeInBytes;
  if (0x400 < SizeInBytes) {
    uVar1 = 0;
    do {
      sVar2 = SizeInBytes;
      SizeInBytes = sVar2 >> 10;
      uVar1 = uVar1 + 1;
    } while (0x1003ff < sVar2);
  }
  if (uVar1 == 0 || 99 < SizeInBytes) {
    snprintf(Output,0x100,"%zd %s",SizeInBytes,(&DAT_00889e40)[uVar1]);
    return;
  }
  snprintf(Output,0x100,"%.1f %s",(double)(long)sVar2 * 0.0009765625,(&DAT_00889e40)[uVar1]);
  return;
}

Assistant:

static void ReadableSizeString(size_t SizeInBytes, char *Output, size_t size)
{
    int i = 0;
    size_t LastSizeInBytes = SizeInBytes;
    char *byteUnits[] = {"bytes", "kB", "MB", "GB", "TB", "PB", "EB", "ZB", "YB"};

    while (SizeInBytes > 1024)
    {
        LastSizeInBytes = SizeInBytes;
        SizeInBytes = SizeInBytes / 1024;
        i++;
    }

    if ((SizeInBytes < 100) && (i != 0))
    {
        snprintf(Output, size, "%.1f %s", ((double)LastSizeInBytes) / 1024, byteUnits[i]);
    }
    else
    {
        snprintf(Output, size, "%zd %s", SizeInBytes, byteUnits[i]);
    }
}